

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O2

TIntermTyped * __thiscall
glslang::TIntermediate::addSwizzle<glslang::TMatrixSelector>
          (TIntermediate *this,TSwizzleSelectors<glslang::TMatrixSelector> *selector,TSourceLoc *loc
          )

{
  int iVar1;
  TMatrixSelector in_RAX;
  TIntermAggregate *this_00;
  undefined4 extraout_var;
  int i;
  int i_00;
  TIntermediate *this_01;
  TMatrixSelector local_38;
  
  local_38 = in_RAX;
  this_00 = (TIntermAggregate *)TIntermNode::operator_new((TIntermNode *)0x188,(size_t)selector);
  TIntermAggregate::TIntermAggregate(this_00,EOpSequence);
  (*(this_00->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[1])
            (this_00,loc);
  iVar1 = (*(this_00->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [0x32])(this_00);
  for (i_00 = 0; i_00 < selector->size_; i_00 = i_00 + 1) {
    this_01 = (TIntermediate *)selector;
    local_38 = TSwizzleSelectors<glslang::TMatrixSelector>::operator[](selector,i_00);
    pushSelector(this_01,(TIntermSequence *)CONCAT44(extraout_var,iVar1),&local_38,loc);
  }
  return (TIntermTyped *)this_00;
}

Assistant:

TIntermTyped* TIntermediate::addSwizzle(TSwizzleSelectors<selectorType>& selector, const TSourceLoc& loc)
{
    TIntermAggregate* node = new TIntermAggregate(EOpSequence);

    node->setLoc(loc);
    TIntermSequence &sequenceVector = node->getSequence();

    for (int i = 0; i < selector.size(); i++)
        pushSelector(sequenceVector, selector[i], loc);

    return node;
}